

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

void __thiscall
helics::BrokerBase::BrokerBase(BrokerBase *this,string_view broker_name,bool DisableQueue)

{
  undefined1 local_39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->_vptr_BrokerBase = (_func_int **)&PTR__BrokerBase_005639e8;
  this->global_id = (GlobalBrokerId)0x0;
  this->global_broker_id_local = -2010000000;
  this->higher_broker_id = 0;
  this->maxLogLevel = (__atomic_base<int>)0xfffffffc;
  this->minFederateCount = 1;
  this->minBrokerCount = 0;
  this->maxFederateCount = 0x7fffffff;
  this->maxBrokerCount = 0x7fffffff;
  this->minChildCount = 0;
  this->maxIterationCount = 10000;
  (this->tickTimer).internalTimeCode = 5000000000;
  (this->timeout).internalTimeCode = 30000000000;
  (this->networkTimeout).internalTimeCode = -1000000000;
  (this->queryTimeout).internalTimeCode = 15000000000;
  (this->errorDelay).internalTimeCode = 0;
  (this->grantTimeout).internalTimeCode = -1000000000;
  (this->maxCoSimDuration).internalTimeCode = -1000000000;
  local_38 = &(this->identifier).field_2;
  (this->identifier)._M_dataplus._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->identifier,broker_name._M_str,broker_name._M_str + broker_name._M_len)
  ;
  (this->brokerKey)._M_dataplus._M_p = (pointer)&(this->brokerKey).field_2;
  (this->brokerKey)._M_string_length = 0;
  (this->brokerKey).field_2._M_local_buf[0] = '\0';
  (this->address)._M_dataplus._M_p = (pointer)&(this->address).field_2;
  (this->address)._M_string_length = 0;
  (this->address).field_2._M_local_buf[0] = '\0';
  (this->queueProcessingThread)._M_id._M_thread = 0;
  this->haltOperations = (__atomic_base<bool>)0x0;
  this->restrictive_time_policy = false;
  this->terminate_on_error = false;
  this->debugging = false;
  this->observer = false;
  this->globalTime = false;
  this->asyncTime = false;
  this->dynamicFederation = false;
  this->dynamicFederation = false;
  this->disableDynamicSources = false;
  this->mainLoopIsRunning = (__atomic_base<bool>)0x0;
  this->dumplog = false;
  this->queueDisabled = DisableQueue;
  this->disable_timer = false;
  (this->messageCounter).super___atomic_base<unsigned_long>._M_i = 0;
  (this->timeCoord)._M_t.
  super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
  .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl =
       (BaseTimeCoordinator *)0x0;
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  BlockingPriorityQueue(&this->actionQueue);
  (this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::LogManager,std::allocator<helics::LogManager>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(LogManager **)&this->mLogManager,
             (allocator<helics::LogManager> *)&local_39);
  this->noAutomaticID = false;
  this->hasTimeDependency = false;
  this->enteredExecutionMode = false;
  this->waitingForBrokerPingReply = false;
  this->hasFilters = false;
  this->no_ping = false;
  this->uuid_like = false;
  this->useJsonSerialization = false;
  this->enable_profiling = false;
  this->allowRemoteControl = true;
  this->errorOnUnmatchedConnections = false;
  this->globalDisconnect = false;
  (this->errorTimeStart).__d.__r = 0;
  (this->disconnectTime).__d.__r = 0;
  (this->lastErrorCode).super___atomic_base<int>._M_i = 0;
  (this->lastErrorString)._M_dataplus._M_p = (pointer)&(this->lastErrorString).field_2;
  (this->lastErrorString)._M_string_length = 0;
  (this->lastErrorString).field_2._M_local_buf[0] = '\0';
  (this->configString)._M_dataplus._M_p = (pointer)&(this->configString).field_2;
  (this->configString)._M_string_length = 0;
  (this->configString).field_2._M_local_buf[0] = '\0';
  this->fileInUse = false;
  this->forwardingReasons = 0;
  (this->prBuff).super___shared_ptr<helics::ProfilerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->prBuff).super___shared_ptr<helics::ProfilerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->forwardTick = false;
  (this->brokerState)._M_i = CREATED;
  return;
}

Assistant:

BrokerBase::BrokerBase(std::string_view broker_name, bool DisableQueue):
    identifier(broker_name), queueDisabled(DisableQueue),
    mLogManager(std::make_shared<LogManager>())
{
}